

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
UnsignedLongsEqualFailure::UnsignedLongsEqualFailure
          (UnsignedLongsEqualFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          unsigned_long expected,unsigned_long actual,SimpleString *text)

{
  undefined1 local_108 [72];
  SimpleString expectedReported;
  SimpleString local_98;
  undefined1 local_88 [8];
  SimpleString actualReported;
  SimpleString eDecimal;
  SimpleString aDecimal;
  unsigned_long local_38;
  unsigned_long actual_local;
  unsigned_long expected_local;
  size_t lineNumber_local;
  char *fileName_local;
  UtestShell *test_local;
  UnsignedLongsEqualFailure *this_local;
  
  local_38 = actual;
  actual_local = expected;
  expected_local = lineNumber;
  lineNumber_local = (size_t)fileName;
  fileName_local = (char *)test;
  test_local = (UtestShell *)this;
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure =
       (_func_int **)&PTR__UnsignedLongsEqualFailure_0042ea28;
  TestFailure::createUserText((TestFailure *)&stack0xffffffffffffffb8,(SimpleString *)this);
  SimpleString::operator=
            (&(this->super_TestFailure).message_,(SimpleString *)&stack0xffffffffffffffb8);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffb8);
  StringFrom((unsigned_long)&eDecimal.bufferSize_);
  StringFrom((unsigned_long)&actualReported.bufferSize_);
  SimpleString::padStringsToSameLength
            ((SimpleString *)&eDecimal.bufferSize_,(SimpleString *)&actualReported.bufferSize_,' ');
  SimpleString::SimpleString((SimpleString *)&stack0xffffffffffffff58," ");
  SimpleString::operator+(&local_98,(SimpleString *)&eDecimal.bufferSize_);
  BracketsFormattedHexStringFrom((unsigned_long)&expectedReported.bufferSize_);
  SimpleString::operator+((SimpleString *)local_88,&local_98);
  SimpleString::~SimpleString((SimpleString *)&expectedReported.bufferSize_);
  SimpleString::~SimpleString(&local_98);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffff58);
  SimpleString::SimpleString((SimpleString *)(local_108 + 0x20)," ");
  SimpleString::operator+
            ((SimpleString *)(local_108 + 0x30),(SimpleString *)&actualReported.bufferSize_);
  BracketsFormattedHexStringFrom((unsigned_long)(local_108 + 0x10));
  SimpleString::operator+((SimpleString *)(local_108 + 0x40),(SimpleString *)(local_108 + 0x30));
  SimpleString::~SimpleString((SimpleString *)(local_108 + 0x10));
  SimpleString::~SimpleString((SimpleString *)(local_108 + 0x30));
  SimpleString::~SimpleString((SimpleString *)(local_108 + 0x20));
  TestFailure::createButWasString
            ((TestFailure *)local_108,(SimpleString *)this,(SimpleString *)(local_108 + 0x40));
  SimpleString::operator+=(&(this->super_TestFailure).message_,(SimpleString *)local_108);
  SimpleString::~SimpleString((SimpleString *)local_108);
  SimpleString::~SimpleString((SimpleString *)(local_108 + 0x40));
  SimpleString::~SimpleString((SimpleString *)local_88);
  SimpleString::~SimpleString((SimpleString *)&actualReported.bufferSize_);
  SimpleString::~SimpleString((SimpleString *)&eDecimal.bufferSize_);
  return;
}

Assistant:

UnsignedLongsEqualFailure::UnsignedLongsEqualFailure(UtestShell* test, const char* fileName, size_t lineNumber, unsigned long expected, unsigned long actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    SimpleString aDecimal = StringFrom(actual);
    SimpleString eDecimal = StringFrom(expected);

    SimpleString::padStringsToSameLength(aDecimal, eDecimal, ' ');

    SimpleString actualReported = aDecimal + " " + BracketsFormattedHexStringFrom(actual);
    SimpleString expectedReported = eDecimal + " " + BracketsFormattedHexStringFrom(expected);

    message_ += createButWasString(expectedReported, actualReported);
}